

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directional_light.cpp
# Opt level: O3

Light_EvalRes *
embree::DirectionalLight_eval(Light *super,DifferentialGeometry *param_2,Vec3fa *dir)

{
  Light_EvalRes *res;
  Light_EvalRes *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  in_RDI->dist = INFINITY;
  fVar1 = 0.0;
  fVar2 = 0.0;
  fVar3 = 0.0;
  fVar4 = 0.0;
  fVar5 = 0.0;
  if (((float)super[0x14].type < 0.9999999) &&
     ((float)super[0x14].type <
      (float)super[0xe].type * (dir->field_0).m128[2] +
      (float)super[0xd].type * (dir->field_0).m128[1] +
      (float)super[0xc].type * (dir->field_0).m128[0])) {
    fVar1 = (float)super[0x15].type;
    fVar2 = fVar1 * (float)super[0x10].type;
    fVar3 = fVar1 * (float)super[0x11].type;
    fVar4 = fVar1 * (float)super[0x12].type;
    fVar5 = fVar1 * (float)super[0x13].type;
  }
  (in_RDI->value).field_0.m128[0] = fVar2;
  (in_RDI->value).field_0.m128[1] = fVar3;
  (in_RDI->value).field_0.m128[2] = fVar4;
  (in_RDI->value).field_0.m128[3] = fVar5;
  in_RDI->pdf = fVar1;
  return in_RDI;
}

Assistant:

SYCL_EXTERNAL Light_EvalRes DirectionalLight_eval(const Light* super,
                                                                 const DifferentialGeometry&,
                                                                 const Vec3fa& dir)
{
  DirectionalLight* self = (DirectionalLight*)super;
  Light_EvalRes res;
  res.dist = inf;

  if (self->cosAngle < COS_ANGLE_MAX && dot(self->frame.vz, dir) > self->cosAngle) {
    res.value = self->radiance * self->pdf;
    res.pdf = self->pdf;
  } else {
    res.value = Vec3fa(0.f);
    res.pdf = 0.f;
  }

  return res;
}